

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__getn(stbi__context *s,stbi_uc *buffer,int n)

{
  bool bVar1;
  uint in_EAX;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar3 = (int)s->img_buffer_end - (int)s->img_buffer;
    iVar4 = n - iVar3;
    if (iVar4 != 0 && iVar3 <= n) {
      memcpy(buffer,s->img_buffer,(long)iVar3);
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)(buffer + iVar3),iVar4);
      in_EAX = (uint)(iVar2 == iVar4);
      s->img_buffer = s->img_buffer_end;
    }
    if (iVar3 < n) {
      return in_EAX;
    }
  }
  __n = (size_t)n;
  bVar1 = s->img_buffer + __n <= s->img_buffer_end;
  if (bVar1) {
    memcpy(buffer,s->img_buffer,__n);
    s->img_buffer = s->img_buffer + __n;
  }
  return (uint)bVar1;
}

Assistant:

static int stbi__getn(stbi__context *s, stbi_uc *buffer, int n)
{
   if (s->io.read) {
      int blen = (int) (s->img_buffer_end - s->img_buffer);
      if (blen < n) {
         int res, count;

         memcpy(buffer, s->img_buffer, blen);

         count = (s->io.read)(s->io_user_data, (char*) buffer + blen, n - blen);
         res = (count == (n-blen));
         s->img_buffer = s->img_buffer_end;
         return res;
      }
   }

   if (s->img_buffer+n <= s->img_buffer_end) {
      memcpy(buffer, s->img_buffer, n);
      s->img_buffer += n;
      return 1;
   } else
      return 0;
}